

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall
CTPNCodeBodyBase::CTPNCodeBodyBase
          (CTPNCodeBodyBase *this,CTcPrsSymtab *lcltab,CTcPrsSymtab *gototab,CTPNStm *stm,int argc,
          int opt_argc,int varargs,int varargs_list,CTcSymLocal *varargs_list_local,int param_9,
          int self_valid,CTcCodeBodyRef *enclosing_code_body)

{
  long lVar1;
  CTcTokenizer *pCVar2;
  
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR___cxa_pure_virtual_00311818;
  lVar1 = G_prs->cur_linenum_;
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.file_ = G_prs->cur_desc_;
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar1;
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)0x0;
  (this->super_CTPNStmTop).next_stm_top_ = (CTPNStmTop *)0x0;
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR___cxa_pure_virtual_0030f068;
  this->lcltab_ = lcltab;
  this->gototab_ = gototab;
  this->stm_ = stm;
  this->argc_ = argc;
  this->opt_argc_ = opt_argc;
  this->varargs_list_local_ = varargs_list_local;
  this->local_cnt_ = param_9;
  this->enclosing_code_body_ = enclosing_code_body;
  this->local_ctx_arr_size_ = 0;
  this->ctx_head_ = (CTcCodeBodyCtx *)0x0;
  this->ctx_tail_ = (CTcCodeBodyCtx *)0x0;
  this->fixup_owner_sym_ = (CTcSymFunc *)0x0;
  this->internal_fixups_ = (CTcAbsFixup *)0x0;
  this->fixup_list_anchor_ = &this->internal_fixups_;
  *(ushort *)&this->field_0xb8 =
       (ushort)((self_valid & 1U) << 6) |
       ((ushort)varargs_list & 1) + ((ushort)varargs & 1) * 2 |
       (ushort)*(undefined4 *)&this->field_0xb8 & 0xe000;
  this->start_desc_ = (CTcTokFileDesc *)0x0;
  this->start_linenum_ = 0;
  pCVar2 = G_tok;
  this->end_desc_ = G_tok->last_desc_;
  this->end_linenum_ = pCVar2->last_linenum_;
  return;
}

Assistant:

CTPNCodeBodyBase::CTPNCodeBodyBase(
    CTcPrsSymtab *lcltab, CTcPrsSymtab *gototab, CTPNStm *stm,
    int argc, int opt_argc, int varargs,
    int varargs_list, CTcSymLocal *varargs_list_local, int local_cnt,
    int self_valid, CTcCodeBodyRef *enclosing_code_body)
{
    /* remember the data in the code body */
    lcltab_ = lcltab;
    gototab_ = gototab;
    stm_ = stm;
    argc_ = argc;
    opt_argc_ = opt_argc;
    varargs_ = varargs;
    varargs_list_ = varargs_list;
    varargs_list_local_ = varargs_list_local;
    local_cnt_ = local_cnt;
    self_valid_ = self_valid;
    self_referenced_ = FALSE;
    full_method_ctx_referenced_ = FALSE;
    op_overload_ = FALSE;
    is_anon_method_ = FALSE;
    is_dyn_func_ = FALSE;
    is_dyn_method_ = FALSE;

    /* remember the enclosing code body */
    enclosing_code_body_ = enclosing_code_body;

    /* presume we won't need a local context object */
    has_local_ctx_ = FALSE;
    local_ctx_arr_size_ = 0;
    ctx_head_ = ctx_tail_ = 0;
    local_ctx_needs_self_ = FALSE;
    local_ctx_needs_full_method_ctx_ = FALSE;

    /* presume we have an internal fixup list */
    fixup_owner_sym_ = 0;
    fixup_list_anchor_ = &internal_fixups_;

    /* no internal fixups yet */
    internal_fixups_ = 0;

    /* we haven't been replaced yet */
    replaced_ = FALSE;

    /* leave it up to the caller to set the starting location */
    start_desc_ = 0;
    start_linenum_ = 0;

    /* 
     *   remember the source location of the closing brace, which should
     *   be the current location when we're instantiated 
     */
    end_desc_ = G_tok->get_last_desc();
    end_linenum_ = G_tok->get_last_linenum();
}